

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O2

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe11At2(uint8_t *buf)

{
  return (ulong)((*buf & 0x3f) << 5 | (uint)(buf[1] >> 3));
}

Assistant:

std::uint64_t readFlUIntBe11At2(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 5;
    res |= (buf[1] >> 3);
    res &= UINT64_C(0x7ff);
    return res;
}